

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleCompareCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  const_reference __lhs;
  const_reference __rhs;
  const_reference name;
  undefined1 local_c8 [8];
  string e;
  bool result;
  string *outvar;
  string *right;
  string *left;
  undefined1 local_80 [8];
  string e_1;
  string *mode;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command COMPARE requires a mode to be specified.",&local_41)
    ;
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    e_1.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](local_20,1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            e_1.field_2._8_8_,"EQUAL");
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"NOTEQUAL"), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)e_1.field_2._8_8_,"LESS"), bVar1)) ||
       (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"LESS_EQUAL"), bVar1 ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"GREATER"), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)e_1.field_2._8_8_,"GREATER_EQUAL"), bVar1)))) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar3 < 5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_80,"sub-command COMPARE, mode ",(allocator *)((long)&left + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&left + 7));
        std::__cxx11::string::operator+=((string *)local_80,(string *)e_1.field_2._8_8_);
        std::__cxx11::string::operator+=
                  ((string *)local_80," needs at least 5 arguments total to command.");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_80);
        this_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_80);
      }
      else {
        __lhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,2);
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,3);
        name = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )e_1.field_2._8_8_,"LESS");
        if (bVar1) {
          e.field_2._M_local_buf[0xf] = std::operator<(__lhs,__rhs);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"LESS_EQUAL");
          if (bVar1) {
            e.field_2._M_local_buf[0xf] = std::operator<=(__lhs,__rhs);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)e_1.field_2._8_8_,"GREATER");
            if (bVar1) {
              e.field_2._M_local_buf[0xf] = std::operator>(__lhs,__rhs);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)e_1.field_2._8_8_,"GREATER_EQUAL");
              if (bVar1) {
                e.field_2._M_local_buf[0xf] = std::operator>=(__lhs,__rhs);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)e_1.field_2._8_8_,"EQUAL");
                if (bVar1) {
                  e.field_2._M_local_buf[0xf] = std::operator==(__lhs,__rhs);
                }
                else {
                  _Var2 = std::operator==(__lhs,__rhs);
                  e.field_2._M_local_buf[0xf] = (_Var2 ^ 0xffU) & 1;
                }
              }
            }
          }
        }
        if (e.field_2._M_local_buf[0xf] == '\0') {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"0");
        }
        else {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"1");
        }
        this_local._7_1_ = 1;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "sub-command COMPARE does not recognize mode ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     e_1.field_2._8_8_);
      cmCommand::SetError(&this->super_cmCommand,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c8);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_c8);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleCompareCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e = "sub-command COMPARE, mode ";
      e += mode;
      e += " needs at least 5 arguments total to command.";
      this->SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      this->Makefile->AddDefinition(outvar, "1");
    } else {
      this->Makefile->AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  this->SetError(e);
  return false;
}